

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.cpp
# Opt level: O0

void __thiscall
cppcms::forwarder::remove_forwarding_rule(forwarder *this,shared_ptr<cppcms::mount_point> *p)

{
  unique_lock<booster::shared_mutex> *in_RDI;
  unique_lock<booster::shared_mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  
  std::unique_lock<booster::shared_mutex>::unique_lock(in_RDI,in_stack_ffffffffffffffb8);
  std::
  map<std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<std::shared_ptr<cppcms::mount_point>_>,_std::allocator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  ::erase((map<std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<std::shared_ptr<cppcms::mount_point>_>,_std::allocator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
           *)in_RDI,(key_type *)in_stack_ffffffffffffffb8);
  std::unique_lock<booster::shared_mutex>::~unique_lock(in_RDI);
  return;
}

Assistant:

void forwarder::remove_forwarding_rule(booster::shared_ptr<mount_point> p)
	{
		booster::unique_lock<booster::shared_mutex> lock(mutex_);
		rules_.erase(p);
	}